

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

keynode * keynode_new(char *k,int l)

{
  keynode *pkVar1;
  char *__dest;
  
  pkVar1 = (keynode *)malloc(0x18);
  pkVar1->len = (uint8_t)l;
  __dest = (char *)malloc((long)l);
  pkVar1->key = __dest;
  memcpy(__dest,k,(long)l);
  pkVar1->next = (keynode *)0x0;
  pkVar1->value = -1;
  return pkVar1;
}

Assistant:

struct keynode *keynode_new(char*k, int l) {
	struct keynode *node = malloc(sizeof(struct keynode));
	node->len = l;
	node->key = malloc(l);
	memcpy(node->key, k, l);
	node->next = 0;
	node->value = -1;
	return node;
}